

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall ast::FunctionStmt::FunctionStmt(FunctionStmt *this,Token *token,int line)

{
  TokenType TVar1;
  pointer pcVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  TVar1 = token->Type;
  pcVar2 = (token->Literal)._M_dataplus._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + (token->Literal)._M_string_length);
  (this->super_ExpressionStmt).super_Stmt.super_Node.lineno = line;
  (this->super_ExpressionStmt).super_Stmt.super_Node.type_value = FunctionStmtType;
  (this->super_ExpressionStmt).super_Stmt.super_Node._vptr_Node =
       (_func_int **)&PTR__ExpressionStmt_00179770;
  (this->super_ExpressionStmt).tok._vptr_Token = (_func_int **)&PTR__Token_001788e0;
  (this->super_ExpressionStmt).tok.Type = TVar1;
  (this->super_ExpressionStmt).tok.Literal._M_dataplus._M_p =
       (pointer)&(this->super_ExpressionStmt).tok.Literal.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_ExpressionStmt).tok.Literal,local_40,local_38 + (long)local_40)
  ;
  (this->super_ExpressionStmt).Expression = (Expr *)0x0;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  (this->super_ExpressionStmt).super_Stmt.super_Node._vptr_Node =
       (_func_int **)&PTR__ExpressionStmt_00179ab0;
  return;
}

Assistant:

FunctionStmt(Token token, int line)
        :ExpressionStmt(token, line, NodeType::FunctionStmtType){}